

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

GeneratorTracker *
Catch::Generators::GeneratorTracker::acquire(TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  element_type *peVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  int __oflag;
  char *pcVar6;
  char *__file;
  ITrackerPtr thisTracker;
  shared_ptr<Catch::Generators::GeneratorTracker> tracker;
  undefined1 auStack_58 [32];
  __shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2> local_38;
  ITracker *local_20;
  
  pcVar6 = auStack_58;
  __file = auStack_58;
  local_38._M_ptr = (GeneratorTracker *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pIVar1 = ctx->m_currentTracker;
  bVar3 = TestCaseTracking::operator==(&pIVar1->m_nameAndLocation,nameAndLocation);
  if (bVar3) {
    iVar5 = (*pIVar1->_vptr_ITracker[7])(pIVar1);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x60))
              (auStack_58 + 0x10,(long *)CONCAT44(extraout_var,iVar5),nameAndLocation);
    if ((long *)auStack_58._16_8_ == (long *)0x0) {
      __assert_fail("thisTracker",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/clauswilke[P]pinetree/tests/./lib/catch.hpp"
                    ,0x3143,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
    cVar4 = (**(code **)(*(long *)auStack_58._16_8_ + 0x78))();
    if (cVar4 == '\0') {
      __assert_fail("thisTracker->isGeneratorTracker()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/clauswilke[P]pinetree/tests/./lib/catch.hpp"
                    ,0x3144,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
  }
  else {
    (*pIVar1->_vptr_ITracker[0xc])(auStack_58 + 0x10,pIVar1,nameAndLocation);
    if ((long *)auStack_58._16_8_ == (long *)0x0) {
      local_20 = pIVar1;
      std::
      make_shared<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
                ((NameAndLocation *)auStack_58,(TrackerContext *)nameAndLocation,(ITracker **)ctx);
      clara::std::__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&local_38,
                (__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2> *)
                auStack_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
      std::__shared_ptr<Catch::TestCaseTracking::ITracker,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Catch::Generators::GeneratorTracker,void>
                ((__shared_ptr<Catch::TestCaseTracking::ITracker,(__gnu_cxx::_Lock_policy)2> *)
                 auStack_58,&local_38);
      (*pIVar1->_vptr_ITracker[0xb])(pIVar1);
      goto LAB_00140a25;
    }
    cVar4 = (**(code **)(*(long *)auStack_58._16_8_ + 0x78))();
    if (cVar4 == '\0') {
      __assert_fail("childTracker->isGeneratorTracker()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/clauswilke[P]pinetree/tests/./lib/catch.hpp"
                    ,0x3148,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
  }
  std::static_pointer_cast<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::ITracker>
            ((shared_ptr<Catch::TestCaseTracking::ITracker> *)auStack_58);
  clara::std::__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&local_38,
            (__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2> *)
            auStack_58);
  __file = pcVar6;
LAB_00140a25:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 0x18));
  iVar5 = (*((local_38._M_ptr)->super_TrackerBase).super_ITracker._vptr_ITracker[2])();
  if ((char)iVar5 == '\0') {
    TestCaseTracking::TrackerBase::open(&(local_38._M_ptr)->super_TrackerBase,__file,__oflag);
  }
  peVar2 = local_38._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_refcount);
  return peVar2;
}

Assistant:

static GeneratorTracker& acquire( TrackerContext& ctx, TestCaseTracking::NameAndLocation const& nameAndLocation ) {
                std::shared_ptr<GeneratorTracker> tracker;

                ITracker& currentTracker = ctx.currentTracker();
                // Under specific circumstances, the generator we want
                // to acquire is also the current tracker. If this is
                // the case, we have to avoid looking through current
                // tracker's children, and instead return the current
                // tracker.
                // A case where this check is important is e.g.
                //     for (int i = 0; i < 5; ++i) {
                //         int n = GENERATE(1, 2);
                //     }
                //
                // without it, the code above creates 5 nested generators.
                if (currentTracker.nameAndLocation() == nameAndLocation) {
                    auto thisTracker = currentTracker.parent().findChild(nameAndLocation);
                    assert(thisTracker);
                    assert(thisTracker->isGeneratorTracker());
                    tracker = std::static_pointer_cast<GeneratorTracker>(thisTracker);
                } else if ( TestCaseTracking::ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
                    assert( childTracker );
                    assert( childTracker->isGeneratorTracker() );
                    tracker = std::static_pointer_cast<GeneratorTracker>( childTracker );
                } else {
                    tracker = std::make_shared<GeneratorTracker>( nameAndLocation, ctx, &currentTracker );
                    currentTracker.addChild( tracker );
                }

                if( !tracker->isComplete() ) {
                    tracker->open();
                }

                return *tracker;
            }